

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_tree.h
# Opt level: O2

int expression_tree::sequential::
    evaluate<int,expression_tree::no_caching,expression_tree::sequential>
              (operation<int> *o,
              node<int,_expression_tree::no_caching,_expression_tree::sequential> *l,
              node<int,_expression_tree::no_caching,_expression_tree::sequential> *r)

{
  int iVar1;
  int local_20;
  int local_1c;
  
  local_1c = (*((l->impl)._M_t.
                super___uniq_ptr_impl<expression_tree::detail::node_impl<int>,_std::default_delete<expression_tree::detail::node_impl<int>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_expression_tree::detail::node_impl<int>_*,_std::default_delete<expression_tree::detail::node_impl<int>_>_>
                .super__Head_base<0UL,_expression_tree::detail::node_impl<int>_*,_false>.
               _M_head_impl)->_vptr_node_impl[4])();
  local_20 = (*((r->impl)._M_t.
                super___uniq_ptr_impl<expression_tree::detail::node_impl<int>,_std::default_delete<expression_tree::detail::node_impl<int>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_expression_tree::detail::node_impl<int>_*,_std::default_delete<expression_tree::detail::node_impl<int>_>_>
                .super__Head_base<0UL,_expression_tree::detail::node_impl<int>_*,_false>.
               _M_head_impl)->_vptr_node_impl[4])();
  iVar1 = std::function<int_(const_int_&,_const_int_&)>::operator()(o,&local_1c,&local_20);
  return iVar1;
}

Assistant:

static T evaluate(const detail::operation<T>& o, const node<T, C, E>& l, const node<T, C, E>& r)
	{
		return o(l.evaluate(), r.evaluate());
	}